

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_PackBegin(nk_tt_pack_context *spc,uchar *pixels,int pw,int ph,int stride_in_bytes,
                   int padding,nk_allocator *alloc)

{
  nk_rp_context *context_00;
  nk_rp_node *nodes_00;
  int local_4c;
  nk_rp_node *nodes;
  nk_rp_context *context;
  int num_nodes;
  int padding_local;
  int stride_in_bytes_local;
  int ph_local;
  int pw_local;
  uchar *pixels_local;
  nk_tt_pack_context *spc_local;
  
  context_00 = (nk_rp_context *)(*alloc->alloc)(alloc->userdata,(void *)0x0,0x48);
  nodes_00 = (nk_rp_node *)(*alloc->alloc)(alloc->userdata,(void *)0x0,(long)(pw - padding) << 4);
  if ((context_00 == (nk_rp_context *)0x0) || (nodes_00 == (nk_rp_node *)0x0)) {
    if (context_00 != (nk_rp_context *)0x0) {
      (*alloc->free)(alloc->userdata,context_00);
    }
    if (nodes_00 != (nk_rp_node *)0x0) {
      (*alloc->free)(alloc->userdata,nodes_00);
    }
    spc_local._4_4_ = 0;
  }
  else {
    spc->width = pw;
    spc->height = ph;
    spc->pixels = pixels;
    spc->pack_info = context_00;
    spc->nodes = nodes_00;
    spc->padding = padding;
    local_4c = pw;
    if (stride_in_bytes != 0) {
      local_4c = stride_in_bytes;
    }
    spc->stride_in_bytes = local_4c;
    spc->h_oversample = 1;
    spc->v_oversample = 1;
    nk_rp_init_target(context_00,pw - padding,ph - padding,nodes_00,pw - padding);
    if (pixels != (uchar *)0x0) {
      nk_memset(pixels,0,(long)(pw * ph));
    }
    spc_local._4_4_ = 1;
  }
  return spc_local._4_4_;
}

Assistant:

NK_INTERN int
nk_tt_PackBegin(struct nk_tt_pack_context *spc, unsigned char *pixels,
    int pw, int ph, int stride_in_bytes, int padding, struct nk_allocator *alloc)
{
    int num_nodes = pw - padding;
    struct nk_rp_context *context = (struct nk_rp_context *)
        alloc->alloc(alloc->userdata,0, sizeof(*context));
    struct nk_rp_node *nodes = (struct nk_rp_node*)
        alloc->alloc(alloc->userdata,0, (sizeof(*nodes  ) * (nk_size)num_nodes));

    if (context == 0 || nodes == 0) {
        if (context != 0) alloc->free(alloc->userdata, context);
        if (nodes   != 0) alloc->free(alloc->userdata, nodes);
        return 0;
    }

    spc->width = pw;
    spc->height = ph;
    spc->pixels = pixels;
    spc->pack_info = context;
    spc->nodes = nodes;
    spc->padding = padding;
    spc->stride_in_bytes = (stride_in_bytes != 0) ? stride_in_bytes : pw;
    spc->h_oversample = 1;
    spc->v_oversample = 1;

    nk_rp_init_target(context, pw-padding, ph-padding, nodes, num_nodes);
    if (pixels)
        NK_MEMSET(pixels, 0, (nk_size)(pw*ph)); /* background of 0 around pixels */
    return 1;
}